

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O2

ssize_t __thiscall Vault::KeyValue::read(KeyValue *this,int __fd,void *__buf,size_t __nbytes)

{
  size_type __nbytes_00;
  string local_80;
  char *local_60;
  size_t local_58;
  char local_50 [8];
  undefined8 uStack_48;
  string local_40;
  
  Vault::operator+(&local_40,
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)__buf,"?version=");
  Vault::operator+(&local_80,&local_40,(Tiny<Vault::SecretVersionDetail,_long> *)__nbytes);
  __nbytes_00 = local_80._M_string_length;
  local_60 = local_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == &local_80.field_2) {
    uStack_48 = local_80.field_2._8_8_;
  }
  else {
    local_60 = local_80._M_dataplus._M_p;
  }
  local_58 = local_80._M_string_length;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  read(this,__fd,&local_60,__nbytes_00);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::read(const Vault::Path &path,
                      const Vault::SecretVersion &secretVersion) {
  return read(Vault::Path{path + "?version=" + secretVersion});
}